

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sk_gen.c
# Opt level: O2

int genpoly_gen(gf *out,gf *f)

{
  gf gVar1;
  gf gVar2;
  long lVar3;
  long lVar4;
  gf *pgVar5;
  long lVar6;
  gf (*in0) [64];
  long lVar7;
  gf *pgVar8;
  gf *pgVar9;
  gf *pgVar10;
  long lVar11;
  bool bVar12;
  gf *local_20f0;
  gf mat [65] [64];
  
  mat[0][0] = 1;
  for (lVar3 = 1; lVar3 != 0x40; lVar3 = lVar3 + 1) {
    mat[0][lVar3] = 0;
  }
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
    mat[1][lVar3] = f[lVar3];
  }
  lVar3 = 0x3f;
  in0 = mat + 1;
  while (bVar12 = lVar3 != 0, lVar3 = lVar3 + -1, bVar12) {
    GF_mul(in0[1],*in0,f);
    in0 = in0 + 1;
  }
  lVar3 = 1;
  lVar7 = 0x2080;
  pgVar8 = mat[0];
  pgVar9 = mat[0] + 1;
  lVar11 = 0;
  local_20f0 = pgVar8;
  while( true ) {
    if (lVar11 == 0x40) {
      for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
        out[lVar3] = mat[0x40][lVar3];
      }
      return 0;
    }
    pgVar5 = (gf *)((long)mat + lVar11 * 0x82);
    pgVar10 = pgVar9;
    for (lVar6 = lVar3; lVar6 != 0x40; lVar6 = lVar6 + 1) {
      gVar1 = gf_iszero(*pgVar5);
      for (lVar4 = 0; lVar7 != lVar4; lVar4 = lVar4 + 0x80) {
        *(ushort *)((long)pgVar8 + lVar4) =
             *(ushort *)((long)pgVar8 + lVar4) ^ *(ushort *)((long)pgVar10 + lVar4) & gVar1;
      }
      pgVar10 = pgVar10 + 1;
    }
    gVar1 = *pgVar5;
    if (gVar1 == 0) break;
    gVar1 = gf_inv(gVar1);
    for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 0x80) {
      gVar2 = gf_mul(*(gf *)((long)pgVar8 + lVar6),gVar1);
      *(gf *)((long)pgVar8 + lVar6) = gVar2;
    }
    pgVar5 = local_20f0;
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
      if (lVar6 != lVar11) {
        gVar1 = mat[lVar11][lVar6];
        for (lVar4 = 0; lVar7 != lVar4; lVar4 = lVar4 + 0x80) {
          gVar2 = gf_mul(*(gf *)((long)pgVar8 + lVar4),gVar1);
          *(ushort *)((long)pgVar5 + lVar4) = *(ushort *)((long)pgVar5 + lVar4) ^ gVar2;
        }
      }
      pgVar5 = pgVar5 + 1;
    }
    lVar3 = lVar3 + 1;
    lVar7 = lVar7 + -0x80;
    pgVar9 = pgVar9 + 0x41;
    pgVar8 = pgVar8 + 0x41;
    local_20f0 = local_20f0 + 0x40;
    lVar11 = lVar11 + 1;
  }
  return -1;
}

Assistant:

int genpoly_gen(gf *out, gf *f)
{
	int i, j, k, c;

	gf mat[ SYS_T+1 ][ SYS_T ];
	gf mask, inv, t;

	// fill matrix

	mat[0][0] = 1;

	for (i = 1; i < SYS_T; i++)
		mat[0][i] = 0;

	for (i = 0; i < SYS_T; i++)
		mat[1][i] = f[i];

	for (j = 2; j <= SYS_T; j++)
		GF_mul(mat[j], mat[j-1], f);

	// gaussian

	for (j = 0; j < SYS_T; j++)
	{
		for (k = j + 1; k < SYS_T; k++)
		{
			mask = gf_iszero(mat[ j ][ j ]);

			for (c = j; c < SYS_T + 1; c++)
				mat[ c ][ j ] ^= mat[ c ][ k ] & mask;

		}

		if ( mat[ j ][ j ] == 0 ) // return if not systematic
		{
			return -1;
		}

		inv = gf_inv(mat[j][j]);

		for (c = j; c < SYS_T + 1; c++)
			mat[ c ][ j ] = gf_mul(mat[ c ][ j ], inv) ;

		for (k = 0; k < SYS_T; k++)
		{
			if (k != j)
			{
				t = mat[ j ][ k ];

				for (c = j; c < SYS_T + 1; c++)
					mat[ c ][ k ] ^= gf_mul(mat[ c ][ j ], t);
			}
		}
	}

	for (i = 0; i < SYS_T; i++)
		out[i] = mat[ SYS_T ][ i ];

	return 0;
}